

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_448a44::CoalesceProvider::provideStreamData
          (CoalesceProvider *this,QPDFObjGen *param_1,Pipeline *p)

{
  element_type *peVar1;
  string all_description;
  QPDFObjGen local_40;
  string description;
  
  peVar1 = (this->containing_page).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_40.obj = 0;
    local_40.gen = 0;
  }
  else {
    local_40 = peVar1->og;
  }
  QPDFObjGen::unparse_abi_cxx11_(&all_description,&local_40,' ');
  std::operator+(&description,"page object ",&all_description);
  std::__cxx11::string::~string((string *)&all_description);
  all_description._M_dataplus._M_p = (pointer)&all_description.field_2;
  all_description._M_string_length = 0;
  all_description.field_2._M_local_buf[0] = '\0';
  QPDFObjectHandle::pipeContentStreams(&this->old_contents,p,&description,&all_description);
  std::__cxx11::string::~string((string *)&all_description);
  std::__cxx11::string::~string((string *)&description);
  return;
}

Assistant:

void
CoalesceProvider::provideStreamData(QPDFObjGen const&, Pipeline* p)
{
    QTC::TC("qpdf", "QPDFObjectHandle coalesce provide stream data");
    std::string description = "page object " + containing_page.getObjGen().unparse(' ');
    std::string all_description;
    old_contents.pipeContentStreams(p, description, all_description);
}